

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipcdial.c
# Opt level: O0

void nni_posix_ipc_dialer_cb(void *arg,uint ev)

{
  int iVar1;
  int *piVar2;
  socklen_t local_38;
  int fd;
  socklen_t sz;
  int rv;
  nni_aio *aio;
  nni_ipc_dialer *d;
  nni_ipc_conn *c;
  void *pvStack_10;
  uint ev_local;
  void *arg_local;
  
  aio = *(nni_aio **)((long)arg + 0xd8);
  d = (nni_ipc_dialer *)arg;
  c._4_4_ = ev;
  pvStack_10 = arg;
  nni_mtx_lock((nni_mtx *)((long)&(aio->a_task).task_mtx.mtx + 0x10));
  _sz = *(nni_aio **)((long)&d->sa + 0x48);
  if ((_sz == (nni_aio *)0x0) || (iVar1 = nni_aio_list_active(_sz), iVar1 == 0)) {
    nni_mtx_unlock((nni_mtx *)((long)&(aio->a_task).task_mtx.mtx + 0x10));
  }
  else {
    if ((c._4_4_ & 0x20) == 0) {
      local_38 = 4;
      iVar1 = nni_posix_pfd_fd((nni_posix_pfd *)&(d->sd).sd_set_tls);
      iVar1 = getsockopt(iVar1,1,4,&fd,&local_38);
      if (iVar1 < 0) {
        piVar2 = __errno_location();
        fd = *piVar2;
      }
      if (fd == 0x73) {
        nni_mtx_unlock((nni_mtx *)((long)&(aio->a_task).task_mtx.mtx + 0x10));
        return;
      }
      if (fd != 0) {
        fd = nni_plat_errno(fd);
      }
    }
    else {
      fd = 9;
    }
    (d->sa).s_storage.sa_pad[8] = 0;
    nni_aio_list_remove(_sz);
    nni_aio_set_prov_data(_sz,(void *)0x0);
    nni_mtx_unlock((nni_mtx *)((long)&(aio->a_task).task_mtx.mtx + 0x10));
    if (fd == 0) {
      nni_aio_set_output(_sz,0,d);
      nni_aio_finish(_sz,NNG_OK,0);
    }
    else {
      nng_stream_close((nng_stream *)d);
      nng_stream_stop((nng_stream *)d);
      nng_stream_free((nng_stream *)d);
      nni_aio_finish_error(_sz,fd);
    }
  }
  return;
}

Assistant:

void
nni_posix_ipc_dialer_cb(void *arg, unsigned ev)
{
	nni_ipc_conn   *c = arg;
	nni_ipc_dialer *d = c->dialer;
	nni_aio        *aio;
	int             rv;

	nni_mtx_lock(&d->mtx);
	aio = c->dial_aio;
	if ((aio == NULL) || (!nni_aio_list_active(aio))) {
		nni_mtx_unlock(&d->mtx);
		return;
	}

	if ((ev & NNI_POLL_INVAL) != 0) {
		rv = EBADF;

	} else {
		socklen_t sz = sizeof(int);
		int       fd = nni_posix_pfd_fd(&c->pfd);
		if (getsockopt(fd, SOL_SOCKET, SO_ERROR, &rv, &sz) < 0) {
			rv = errno;
		}
		if (rv == EINPROGRESS) {
			// Connection still in progress, come back
			// later.
			nni_mtx_unlock(&d->mtx);
			return;
		} else if (rv != 0) {
			rv = nni_plat_errno(rv);
		}
	}

	c->dial_aio = NULL;
	nni_aio_list_remove(aio);
	nni_aio_set_prov_data(aio, NULL);
	nni_mtx_unlock(&d->mtx);

	if (rv != 0) {
		nng_stream_close(&c->stream);
		nng_stream_stop(&c->stream);
		nng_stream_free(&c->stream);
		nni_aio_finish_error(aio, rv);
		return;
	}

	nni_aio_set_output(aio, 0, c);
	nni_aio_finish(aio, 0, 0);
}